

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

StringPtr __thiscall
capnp::compiler::Compiler::Node::joinDisplayName
          (Node *this,Arena *arena,Node *parent,StringPtr declName)

{
  ChunkHeader *pCVar1;
  char cVar2;
  char *amount;
  StringPtr SVar3;
  
  amount = declName.content.ptr + (long)arena[2].currentChunk;
  SVar3.content.ptr = (char *)kj::Arena::allocateBytes((Arena *)this,(size_t)amount,1,false);
  pCVar1 = arena[2].currentChunk;
  memcpy(SVar3.content.ptr,arena[2].objectList,(size_t)((long)&pCVar1[-1].end + 7));
  cVar2 = '.';
  if (arena->objectList == (ObjectHeader *)0x0) {
    cVar2 = ':';
  }
  (SVar3.content.ptr + -1)[(long)pCVar1] = cVar2;
  memcpy(SVar3.content.ptr + (long)&pCVar1->next,parent,(size_t)(declName.content.ptr + -1));
  (SVar3.content.ptr + -1)[(long)amount] = '\0';
  SVar3.content.size_ = (size_t)amount;
  return (StringPtr)SVar3.content;
}

Assistant:

kj::StringPtr Compiler::Node::joinDisplayName(
    kj::Arena& arena, Node& parent, kj::StringPtr declName) {
  kj::ArrayPtr<char> result = arena.allocateArray<char>(
      parent.displayName.size() + declName.size() + 2);

  size_t separatorPos = parent.displayName.size();
  memcpy(result.begin(), parent.displayName.begin(), separatorPos);
  result[separatorPos] = parent.parent == nullptr ? ':' : '.';
  memcpy(result.begin() + separatorPos + 1, declName.begin(), declName.size());
  result[result.size() - 1] = '\0';
  return kj::StringPtr(result.begin(), result.size() - 1);
}